

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAdda<(moira::Instr)5,(moira::Mode)1,(moira::Size)2>(Moira *this,u16 opcode)

{
  short sVar1;
  int iVar2;
  ulong uVar3;
  
  sVar1 = *(short *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  uVar3 = (ulong)(opcode >> 9 & 7);
  iVar2 = *(int *)((long)this->exec + uVar3 * 4 + -0x38);
  prefetch<4ul>(this);
  (*this->_vptr_Moira[0x19])(this,2);
  (*this->_vptr_Moira[0x19])(this,2);
  *(int *)((long)this->exec + uVar3 * 4 + -0x38) = sVar1 + iVar2;
  return;
}

Assistant:

void
Moira::execAdda(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    data = SEXT<S>(data);

    result = (I == ADDA) ? readA(dst) + data : readA(dst) - data;
    prefetch<POLLIPL>();

    sync(2);
    if (S == Word || isRegMode(M) || isImmMode(M)) sync(2);
    writeA(dst, result);
}